

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.c
# Opt level: O1

exr_result_t
internal_coding_fill_channel_info
          (exr_coding_channel_info_t **channels,int16_t *num_chans,
          exr_coding_channel_info_t *builtinextras,exr_chunk_info_t *cinfo,
          _internal_exr_context *pctxt,_internal_exr_part *part)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  exr_attr_chlist_t *peVar5;
  exr_attr_chlist_entry_t *peVar6;
  uint uVar7;
  int iVar8;
  exr_result_t eVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  uint16_t *puVar13;
  long lVar14;
  
  peVar5 = (part->channels->field_6).chlist;
  iVar1 = peVar5->num_channels;
  lVar11 = (long)iVar1;
  if (5 < lVar11) {
    builtinextras = (exr_coding_channel_info_t *)(*pctxt->alloc_fn)(lVar11 * 0x30);
    if (builtinextras == (exr_coding_channel_info_t *)0x0) {
      eVar9 = (*pctxt->standard_error)(pctxt,1);
      return eVar9;
    }
    memset(builtinextras,0,lVar11 * 0x30);
  }
  if (0 < iVar1) {
    peVar6 = peVar5->entries;
    iVar2 = cinfo->start_y;
    uVar3 = cinfo->height;
    iVar12 = uVar3 + iVar2 + -1;
    puVar13 = &builtinextras->user_data_type;
    lVar14 = 0;
    do {
      ((exr_coding_channel_info_t *)(puVar13 + -0xf))->channel_name =
           *(char **)(peVar6->reserved + lVar14 + -0xd);
      iVar4 = *(int *)(peVar6->reserved + lVar14 + 7);
      uVar7 = uVar3;
      if (1 < iVar4) {
        iVar10 = iVar2 % iVar4;
        if (uVar3 == 1) {
          uVar7 = (uint)(iVar10 == 0);
        }
        else {
          iVar8 = iVar4 - iVar10;
          if (iVar10 == 0) {
            iVar8 = 0;
          }
          iVar10 = iVar12 - iVar12 % iVar4;
          uVar7 = 0;
          if (iVar8 + iVar2 <= iVar10) {
            uVar7 = (iVar10 - (iVar8 + iVar2)) / iVar4 + 1;
          }
        }
      }
      *(uint *)(puVar13 + -0xb) = uVar7;
      iVar10 = *(int *)(peVar6->reserved + lVar14 + 3);
      if (iVar10 < 2) {
        iVar8 = cinfo->width;
      }
      else {
        iVar8 = cinfo->width / iVar10;
      }
      *(int *)(puVar13 + -9) = iVar8;
      *(int *)(puVar13 + -7) = iVar10;
      *(int *)(puVar13 + -5) = iVar4;
      *(uint8_t *)(puVar13 + -3) = peVar6->reserved[lVar14 + -1];
      iVar4 = *(int *)(peVar6->reserved + lVar14 + -5);
      *(char *)((long)puVar13 + -5) = (iVar4 != 1) * '\x02' + '\x02';
      puVar13[-2] = (uint16_t)iVar4;
      puVar13[-1] = (ushort)(iVar4 != 1) * 2 + 2;
      *puVar13 = (uint16_t)iVar4;
      puVar13 = puVar13 + 0x18;
      lVar14 = lVar14 + 0x20;
    } while (lVar11 << 5 != lVar14);
  }
  *channels = builtinextras;
  *num_chans = (int16_t)iVar1;
  return 0;
}

Assistant:

OPENEXR_CORE_INTERNAL_NAMESPACE_SOURCE_ENTER

exr_result_t
internal_coding_fill_channel_info (
    exr_coding_channel_info_t**         channels,
    int16_t*                            num_chans,
    exr_coding_channel_info_t*          builtinextras,
    const exr_chunk_info_t*             cinfo,
    const struct _internal_exr_context* pctxt,
    const struct _internal_exr_part*    part)
{
    int                        chans;
    exr_attr_chlist_t*         chanlist;
    exr_coding_channel_info_t* chanfill;

    chanlist = part->channels->chlist;
    chans    = chanlist->num_channels;
    if (chans <= 5) { chanfill = builtinextras; }
    else
    {
        chanfill = (exr_coding_channel_info_t*) pctxt->alloc_fn (
            (size_t) (chans) * sizeof (exr_coding_channel_info_t));
        if (chanfill == NULL)
            return pctxt->standard_error (pctxt, EXR_ERR_OUT_OF_MEMORY);
        memset (
            chanfill, 0, (size_t) (chans) * sizeof (exr_coding_channel_info_t));
    }

    for (int c = 0; c < chans; ++c)
    {
        const exr_attr_chlist_entry_t* curc = (chanlist->entries + c);
        exr_coding_channel_info_t*     decc = (chanfill + c);

        decc->channel_name = curc->name.str;

        decc->height = compute_sampled_lines (
            cinfo->height, curc->y_sampling, cinfo->start_y);

        if (curc->x_sampling > 1)
            decc->width = cinfo->width / curc->x_sampling;
        else
            decc->width = cinfo->width;

        decc->x_samples         = curc->x_sampling;
        decc->y_samples         = curc->y_sampling;
        decc->p_linear          = curc->p_linear;
        decc->bytes_per_element = (curc->pixel_type == EXR_PIXEL_HALF) ? 2 : 4;
        decc->data_type         = (uint16_t) (curc->pixel_type);

        /* initialize these so they don't trip us up during decoding
         * when the user also chooses to skip a channel */
        decc->user_bytes_per_element = decc->bytes_per_element;
        decc->user_data_type         = decc->data_type;
        /* but leave the rest as zero for the user to fill in */
    }

    *channels  = chanfill;
    *num_chans = (int16_t) chans;

    return EXR_ERR_SUCCESS;
}